

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_mqtt_next_subscribe_topic(mg_mqtt_message *msg,mg_str *topic,uint8_t *qos,int pos)

{
  ushort *puVar1;
  ushort uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (ulong)pos;
  iVar4 = -1;
  if (uVar5 < (msg->payload).len) {
    pcVar3 = (msg->payload).p;
    puVar1 = (ushort *)(pcVar3 + uVar5);
    uVar2 = *puVar1;
    uVar6 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
    topic->len = uVar6;
    topic->p = (char *)(puVar1 + 1);
    *qos = pcVar3[uVar6 + 2 + uVar5];
    iVar4 = (int)topic->len + pos + 3;
  }
  return iVar4;
}

Assistant:

int mg_mqtt_next_subscribe_topic(struct mg_mqtt_message *msg,
                                 struct mg_str *topic, uint8_t *qos, int pos) {
    unsigned char *buf = (unsigned char *) msg->payload.p + pos;
    if ((size_t) pos >= msg->payload.len) {
        return -1;
    }

    topic->len = buf[0] << 8 | buf[1];
    topic->p = (char *) buf + 2;
    *qos = buf[2 + topic->len];
    return pos + 2 + topic->len + 1;
}